

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

void qclab::printMatrix<qclab::dense::SquareMatrix<std::complex<double>>>
               (SquareMatrix<std::complex<double>_> *mat)

{
  complex<double> val;
  ulong uVar1;
  size_t c;
  ulong uVar2;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  size_t r;
  ulong uVar3;
  
  for (uVar3 = 0; uVar1 = mat->size_, uVar3 < uVar1; uVar3 = uVar3 + 1) {
    for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
      val._M_value._8_8_ = unaff_R15;
      val._M_value._0_8_ = unaff_R14;
      print<double>(val);
      uVar1 = mat->size_;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  return;
}

Assistant:

void printMatrix( const T& mat ) {
   for ( size_t r = 0; r < mat.rows(); ++r ) {
     for ( size_t c = 0; c < mat.cols(); ++c ) {
       print( mat(r,c) ) ;
     }
     std::cout << std::endl ;
   }
 }